

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(long lhs,
         SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  long ret;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  long *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  long in_stack_ffffffffffffffd8;
  int *u;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffe0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_14;
  long local_10;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_8;
  int local_4;
  
  local_10 = in_RDI;
  local_8.m_int = in_ESI;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_14);
  bVar1 = DivisionCornerCaseHelper<int,_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1(local_10,local_8,&local_14);
  if (bVar1) {
    local_4 = local_14.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<int,_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
            ::DivisionCornerCase2
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0,
                       (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (bVar1) {
      local_4 = local_14.m_int;
    }
    else {
      u = (int *)0x0;
      iVar2 = SafeInt::operator_cast_to_int
                        ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      DivisionHelper<long,int,5>::
      DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                ((long *)CONCAT44(local_8.m_int,in_stack_ffffffffffffffe0.m_int),u,
                 (long *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<long>((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                     *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    }
  }
  return (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         local_4;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}